

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.cpp
# Opt level: O0

void __thiscall IZDeflate::send_bits(IZDeflate *this,int value,int length)

{
  uint uVar1;
  int length_local;
  int value_local;
  IZDeflate *this_local;
  
  this->bi_buf = value << ((byte)this->bi_valid & 0x1f) | this->bi_buf;
  this->bi_valid = length + this->bi_valid;
  if (0x10 < this->bi_valid) {
    if (this->out_size - 1 <= this->out_offset) {
      flush_outbuf(this->out_buf,&this->out_offset);
    }
    uVar1 = this->out_offset;
    this->out_offset = uVar1 + 1;
    this->out_buf[uVar1] = (char)this->bi_buf;
    uVar1 = this->out_offset;
    this->out_offset = uVar1 + 1;
    this->out_buf[uVar1] = (char)(this->bi_buf >> 8);
    this->bi_valid = this->bi_valid + -0x10;
    this->bi_buf = (uint)value >> ((char)length - (char)this->bi_valid & 0x1fU);
  }
  return;
}

Assistant:

void IZDeflate::send_bits(int value, int length)
    // int value;  /* value to send */
    // int length; /* number of bits */
{
#ifdef DEBUG
    Tracevv((stderr," l %2d v %4x ", length, value));
    Assert(length > 0 && length <= 15, "invalid length");
    bits_sent += (uzoff_t)length;
#endif
    /* If not enough room in bi_buf, use (bi_valid) bits from bi_buf and
     * (Buf_size - bi_valid) bits from value to flush the filled bi_buf,
     * then fill in the rest of (value), leaving (length - (Buf_size-bi_valid))
     * unused bits in bi_buf.
     */
    bi_buf |= (value << bi_valid);
    bi_valid += length;
    if (bi_valid > (int)Buf_size) {
        PUTSHORT(bi_buf);
        bi_valid -= Buf_size;
        bi_buf = (unsigned)value >> (length - bi_valid);
    }
}